

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net.c
# Opt level: O3

sexp_conflict
sexp_25_make_address_info_stub
          (sexp_conflict ctx,sexp_conflict self,sexp_sint_t n,sexp_conflict arg0,sexp_conflict arg1,
          sexp_conflict arg2,sexp_conflict arg3)

{
  sexp_conflict psVar1;
  sexp psVar2;
  sexp_tag_t sVar3;
  int iVar4;
  sexp_conflict res;
  sexp_conflict local_48;
  sexp_gc_var_t local_40;
  
  local_40.var = &local_48;
  local_48 = (sexp_conflict)0x43e;
  local_40.next = (ctx->value).context.saves;
  (ctx->value).context.saves = &local_40;
  psVar1 = (sexp_conflict)sexp_alloc_tagged_aux(ctx,0x20,(long)(self->value).type.setters >> 1);
  local_48 = psVar1;
  psVar2 = (sexp)calloc(1,0x30);
  (psVar1->value).type.slots = psVar2;
  psVar1->field_0x5 = psVar1->field_0x5 | 2;
  if (((ulong)arg0 & 1) == 0) {
    if ((((ulong)arg0 & 2) == 0) && (arg0->tag == 0xc)) {
      iVar4 = (int)(arg0->value).flonum_bits[0] * (int)(arg0->value).uvector.length;
    }
    else {
      iVar4 = 0;
    }
  }
  else {
    iVar4 = (int)((long)arg0 >> 1);
  }
  *(int *)&psVar2->markedp = iVar4;
  if (((ulong)arg1 & 1) == 0) {
    if ((((ulong)arg1 & 2) == 0) && (arg1->tag == 0xc)) {
      iVar4 = (int)(arg1->value).flonum_bits[0] * (int)(arg1->value).uvector.length;
    }
    else {
      iVar4 = 0;
    }
  }
  else {
    iVar4 = (int)((long)arg1 >> 1);
  }
  *(int *)&psVar2->value = iVar4;
  if (((ulong)arg2 & 1) == 0) {
    if ((((ulong)arg2 & 2) == 0) && (arg2->tag == 0xc)) {
      iVar4 = (int)(arg2->value).flonum_bits[0] * (int)(arg2->value).uvector.length;
    }
    else {
      iVar4 = 0;
    }
  }
  else {
    iVar4 = (int)((long)arg2 >> 1);
  }
  *(int *)((long)&psVar2->value + 4) = iVar4;
  if (((ulong)arg3 & 1) == 0) {
    if ((((ulong)arg3 & 2) == 0) && (arg3->tag == 0xc)) {
      sVar3 = (int)(arg3->value).flonum_bits[0] * (int)(arg3->value).uvector.length;
    }
    else {
      sVar3 = 0;
    }
  }
  else {
    sVar3 = (sexp_tag_t)((long)arg3 >> 1);
  }
  psVar2->tag = sVar3;
  (ctx->value).context.saves = local_40.next;
  return local_48;
}

Assistant:

sexp sexp_25_make_address_info_stub (sexp ctx, sexp self, sexp_sint_t n, sexp arg0, sexp arg1, sexp arg2, sexp arg3) {
  struct addrinfo* r;
  sexp_gc_var1(res);
  sexp_gc_preserve1(ctx, res);
  res = sexp_alloc_tagged(ctx, sexp_sizeof(cpointer), sexp_unbox_fixnum(sexp_opcode_return_type(self)));
  sexp_cpointer_value(res) = calloc(1, sizeof(struct addrinfo));
  r = (struct addrinfo*) sexp_cpointer_value(res);
  memset(r, 0, sizeof(struct addrinfo));
  sexp_freep(res) = 1;
  r->ai_family = sexp_sint_value(arg0);
  r->ai_socktype = sexp_sint_value(arg1);
  r->ai_protocol = sexp_sint_value(arg2);
  r->ai_flags = sexp_sint_value(arg3);
  sexp_gc_release1(ctx);
  return res;
}